

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.cxx
# Opt level: O0

ErrorGenerator *
JsonErrors::INVALID_NAMED_OBJECT_KEY
          (ErrorGenerator *__return_storage_ptr__,ObjectError errorType,Members *extraFields)

{
  anon_class_1_0_00000001 local_61;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
  local_60;
  ObjectErrorGenerator local_40;
  Members *local_20;
  Members *extraFields_local;
  ErrorGenerator *pEStack_10;
  ObjectError errorType_local;
  
  local_20 = extraFields;
  extraFields_local._4_4_ = errorType;
  pEStack_10 = __return_storage_ptr__;
  std::function<std::__cxx11::string(Json::Value_const*,cmJSONState*)>::
  function<JsonErrors::INVALID_NAMED_OBJECT_KEY(JsonErrors::ObjectError,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0,void>
            ((function<std::__cxx11::string(Json::Value_const*,cmJSONState*)> *)&local_60,&local_61)
  ;
  INVALID_NAMED_OBJECT(&local_40,&local_60);
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::operator()(__return_storage_ptr__,&local_40,extraFields_local._4_4_,local_20);
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function(&local_40);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_Json::Value_*,_cmJSONState_*)>
  ::~function(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ErrorGenerator INVALID_NAMED_OBJECT_KEY(
  ObjectError errorType, const Json::Value::Members& extraFields)
{
  return INVALID_NAMED_OBJECT(
    [](const Json::Value*, cmJSONState* state) -> std::string {
      for (auto it = state->parseStack.rbegin();
           it != state->parseStack.rend(); ++it) {
        if (it->first.rfind("$vector_item_", 0) == 0) {
          continue;
        }
        return cmStrCat("\"", it->first, "\"");
      }
      return "root";
    })(errorType, extraFields);
}